

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  color_quad_u8 (*pacVar4) [16];
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  int t;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uchar uVar18;
  uchar uVar19;
  uint8 s;
  ulong uVar20;
  color_cluster *pcVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  float fVar26;
  color_quad_u8 endpoint;
  vector<unsigned_char> selectors;
  params params;
  int scan [3];
  results results;
  int refine [4];
  etc1_optimizer optimizer;
  
  uVar17 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
  scan[0] = -1;
  scan[1] = 0;
  scan[2] = 1;
  refine[0] = -3;
  refine[1] = -2;
  refine[2] = 2;
  refine[3] = 3;
  uVar10 = (ulong)(this->m_color_clusters).m_size;
  uVar24 = (uVar10 * data) / uVar17 & 0xffffffff;
  while( true ) {
    if ((((data + 1) * uVar10) / uVar17 & 0xffffffff) <= uVar24) break;
    pcVar21 = (this->m_color_clusters).m_p;
    if (pcVar21[uVar24].pixels.m_size != 0) {
      etc1_optimizer::etc1_optimizer(&optimizer);
      etc1_optimizer::params::params(&params);
      pcVar21 = pcVar21 + uVar24;
      params.m_use_color4 = false;
      params.m_constrain_against_base_color5 = false;
      vector<unsigned_char>::vector(&selectors,(pcVar21->pixels).m_size);
      params.m_pSrc_pixels = (pcVar21->pixels).m_p;
      results.m_pSelectors = selectors.m_p;
      params.m_num_src_pixels = (pcVar21->pixels).m_size;
      results.m_n = params.m_num_src_pixels;
      etc1_optimizer::init(&optimizer,(EVP_PKEY_CTX *)&params);
      params.m_pScan_deltas = scan;
      params.m_scan_delta_size = 3;
      etc1_optimizer::compute(&optimizer);
      if (params.m_num_src_pixels * 0x177 < results.m_error) {
        params.m_pScan_deltas = refine;
        params.m_scan_delta_size = 4;
        etc1_optimizer::compute(&optimizer);
      }
      for (lVar11 = -3; lVar11 != 0; lVar11 = lVar11 + 1) {
        bVar1 = *(byte *)((long)refine + lVar11 + -0x1d);
        endpoint.field_0.c[lVar11 + 3] = bVar1 >> 2 | bVar1 * '\b';
      }
      endpoint.field_0.field_0.a = (char)results.m_block_inten_table;
      pcVar21->first_endpoint = (uint)endpoint.field_0;
      bVar1 = (&DAT_0018d1a0)[(ulong)(results.m_block_inten_table & 0xff) * 2];
      bVar12 = (&DAT_0018d1a1)[(ulong)(results.m_block_inten_table & 0xff) * 2];
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        bVar2 = endpoint.field_0.c[lVar11];
        uVar18 = bVar2 - bVar12;
        if (bVar2 < bVar12) {
          uVar18 = '\0';
        }
        pcVar21->color_values[0].field_0.c[lVar11] = uVar18;
        uVar18 = bVar2 - bVar1;
        if (bVar2 < bVar1) {
          uVar18 = '\0';
        }
        uVar19 = bVar1 + bVar2;
        if (CARRY1(bVar1,bVar2)) {
          uVar19 = 0xff;
        }
        pcVar21->color_values[1].field_0.c[lVar11] = uVar18;
        pcVar21->color_values[2].field_0.c[lVar11] = uVar19;
        uVar18 = bVar2 + bVar12;
        if (CARRY1(bVar2,bVar12)) {
          uVar18 = 0xff;
        }
        pcVar21->color_values[3].field_0.c[lVar11] = uVar18;
      }
      lVar11 = 4;
      lVar14 = 0;
      while (bVar25 = lVar11 != 0, lVar11 = lVar11 + -1, bVar25) {
        pcVar21->color_values[lVar14].field_0.field_0.a = 0xff;
        lVar14 = lVar14 + 1;
      }
      iVar5 = color_quad<unsigned_char,_int>::get_luma(pcVar21->color_values + 3);
      iVar6 = color_quad<unsigned_char,_int>::get_luma(pcVar21->color_values);
      fVar26 = (float)(iVar5 - iVar6) / 100.0;
      if (1.0 <= fVar26) {
        fVar26 = 1.0;
      }
      fVar26 = powf(fVar26,2.7);
      bVar1 = this->m_has_subblocks;
      uVar7 = (uint)bVar1;
      for (uVar16 = 0; uVar16 < pcVar21->blocks[0].m_size; uVar16 = uVar16 + 1) {
        uVar3 = pcVar21->blocks[0].m_p[uVar16];
        uVar15 = (ulong)uVar3;
        pacVar4 = this->m_blocks;
        uVar8 = (uint)(long)((this->m_block_weights).m_p[uVar15] * fVar26 * 32768.0 *
                            *(float *)(&DAT_0018d1f0 +
                                      (ulong)((this->m_block_encodings).m_p[uVar15] == '\0') * 4));
        uVar13 = 0xffff;
        if (uVar8 < 0xffff) {
          uVar13 = uVar8;
        }
        if (uVar8 == 0) {
          uVar13 = 1;
        }
        uVar8 = 0;
        for (lVar11 = 0; lVar11 != (ulong)(uVar7 ^ 1) * 8 + 8; lVar11 = lVar11 + 1) {
          uVar22 = 0xffffffff;
          uVar23 = 0;
          for (uVar20 = 0; uVar23 = uVar23 & 0xff, uVar20 != 4; uVar20 = uVar20 + 1) {
            uVar9 = crnlib::color::color_distance
                              ((this->m_params).m_perceptual,
                               (color_quad_u8 *)
                               ((long)&(*pacVar4)[lVar11].field_0 +
                               (uVar15 << (6 - (bVar1 & 1) & 0x3f))),pcVar21->color_values + uVar20,
                               false);
            if (uVar9 < uVar22) {
              uVar23 = uVar20 & 0xffffffff;
              uVar22 = uVar9;
            }
          }
          uVar8 = uVar8 << 2 | (uint)uVar23;
        }
        bVar1 = this->m_has_subblocks;
        bVar12 = bVar1 << 4 | 0x20;
        if ((uVar3 & 1) != 0) {
          bVar12 = 0x20;
        }
        this->m_block_selectors[0].m_p[uVar15] = (ulong)uVar13 | (ulong)uVar8 << (bVar12 & 0x3f);
      }
      vector<unsigned_char>::~vector(&selectors);
      etc1_optimizer::~etc1_optimizer(&optimizer);
    }
    uVar24 = uVar24 + 1;
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task_etc(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint8 delta[8][2] = { { 2, 8 }, { 5, 17 }, { 9, 29 }, { 13, 42 }, { 18, 60 }, { 24, 80 }, { 33, 106 }, { 47, 183 } };
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };
        for (uint iCluster = m_color_clusters.size() * data / num_tasks, iEnd = m_color_clusters.size() * (data + 1) / num_tasks; iCluster < iEnd; iCluster++)
        {
            color_cluster& cluster = m_color_clusters[iCluster];
            if (cluster.pixels.size())
            {
                etc1_optimizer optimizer;
                etc1_optimizer::params params;
                params.m_use_color4 = false;
                params.m_constrain_against_base_color5 = false;
                etc1_optimizer::results results;
                crnlib::vector<uint8> selectors(cluster.pixels.size());
                params.m_pSrc_pixels = cluster.pixels.get_ptr();
                results.m_pSelectors = selectors.get_ptr();
                results.m_n = params.m_num_src_pixels = cluster.pixels.size();
                optimizer.init(params, results);
                params.m_pScan_deltas = scan;
                params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                optimizer.compute();
                if (results.m_error > 375 * params.m_num_src_pixels)
                {
                    params.m_pScan_deltas = refine;
                    params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                    optimizer.compute();
                }
                color_quad_u8 endpoint;
                for (int c = 0; c < 3; c++)
                {
                    endpoint.c[c] = results.m_block_color_unscaled.c[c] << 3 | results.m_block_color_unscaled.c[c] >> 2;
                }
                endpoint.c[3] = results.m_block_inten_table;
                cluster.first_endpoint = endpoint.m_u32;
                for (uint8 d0 = delta[endpoint.c[3]][0], d1 = delta[endpoint.c[3]][1], c = 0; c < 3; c++)
                {
                    uint8 q = endpoint.c[c];
                    cluster.color_values[0].c[c] = q <= d1 ? 0 : q - d1;
                    cluster.color_values[1].c[c] = q <= d0 ? 0 : q - d0;
                    cluster.color_values[2].c[c] = q >= 255 - d0 ? 255 : q + d0;
                    cluster.color_values[3].c[c] = q >= 255 - d1 ? 255 : q + d1;
                }
                for (int t = 0; t < 4; t++)
                {
                    cluster.color_values[t].c[3] = 0xFF;
                }
                float endpoint_weight = powf(math::minimum((cluster.color_values[3].get_luma() - cluster.color_values[0].get_luma()) / 100.0f, 1.0f), 2.7f);

                crnlib::vector<uint>& blocks = cluster.blocks[cColor];
                uint blockSize = m_has_subblocks ? 8 : 16;
                for (uint i = 0; i < blocks.size(); i++)
                {
                    uint b = blocks[i];
                    color_quad_u8* pixels = m_has_subblocks ? ((color_quad_u8(*)[8])m_blocks)[b] : m_blocks[b];
                    uint weight = (uint)(math::clamp<uint>(0x8000 * endpoint_weight * m_block_weights[b] * (m_block_encodings[b] ? 0.972f : 1.0f), 1, 0xFFFF));
                    uint32 selector = 0;
                    for (uint p = 0; p < blockSize; p++)
                    {
                        uint error_best = cUINT32_MAX;
                        uint8 s_best = 0;
                        for (uint8 s = 0; s < 4; s++)
                        {
                            uint error = color::color_distance(m_params.m_perceptual, pixels[p], cluster.color_values[s], false);
                            if (error < error_best)
                            {
                                s_best = s;
                                error_best = error;
                            }
                        }
                        selector = selector << 2 | s_best;
                    }
                    m_block_selectors[cColor][b] = (uint64)selector << (!m_has_subblocks || (b & 1) ? 32 : 48) | weight;
                }
            }
        }
    }